

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_Disasm.c
# Opt level: O1

void GvEb(PDISASM pMyDisasm)

{
  int iVar1;
  int iVar2;
  
  iVar1 = (pMyDisasm->Reserved_).OperandSize;
  (pMyDisasm->Reserved_).OperandSize = 8;
  (pMyDisasm->Reserved_).MemDecoration = 0x65;
  decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
  iVar2 = (uint)(iVar1 == 0x20) * 0x10 + 0x10;
  if (iVar1 == 0x40) {
    iVar2 = 0x40;
  }
  (pMyDisasm->Reserved_).OperandSize = iVar2;
  decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  return;
}

Assistant:

void __bea_callspec__ GvEb(PDISASM pMyDisasm)
{
  if (GV.OperandSize == 64) {
    GV.MemDecoration = Arg2byte;
    GV.OperandSize = 8;
    decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
    GV.OperandSize = 64;
  }
  else if (GV.OperandSize == 32) {
    GV.MemDecoration = Arg2byte;
    GV.OperandSize = 8;
    decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
    GV.OperandSize = 32;
  }
  else {
    GV.MemDecoration = Arg2byte;
    GV.OperandSize = 8;
    decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
    GV.OperandSize = 16;
  }
  decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
  GV.EIP_ += GV.DECALAGE_EIP+2;
}